

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::anon_unknown_14::IncrementRedactedFieldCounter(void)

{
  LOCK();
  (anonymous_namespace)::num_redacted_field = (anonymous_namespace)::num_redacted_field + 1;
  UNLOCK();
  return;
}

Assistant:

inline void IncrementRedactedFieldCounter() {
  num_redacted_field.fetch_add(1, std::memory_order_relaxed);
}